

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall
dlib::timer<dlib::text_grid>::timer(timer<dlib::text_grid> *this,text_grid *ao_,af_type af_)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  timer_base *in_stack_ffffffffffffffc0;
  
  timer_base::timer_base(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__timer_0055f0b0;
  in_RDI[0x13] = in_RSI;
  in_RDI[0x15] = in_RCX;
  in_RDI[0x14] = in_RDX;
  get_global_clock();
  in_RDI[0x10] = 1000;
  in_RDI[0x11] = 0;
  *(undefined1 *)((long)in_RDI + 0x91) = 0;
  *(undefined1 *)((long)in_RDI + 0x92) = 0;
  return;
}

Assistant:

timer<T>::
    timer(  
        T& ao_,
        af_type af_
    ) : 
        ao(ao_),
        af(af_),
        gc(get_global_clock())
    {
        delay = 1000;
        next_time_to_run = 0;
        running = false;
        in_global_clock = false;
    }